

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_parallel.h
# Opt level: O3

void __thiscall highwayhash::ThreadPool::ThreadPool(ThreadPool *this,int num_threads)

{
  int iVar1;
  ThreadPool *local_38;
  
  this->num_threads_ = num_threads;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->workers_ready_cv_);
  this->workers_ready_ = 0;
  std::condition_variable::condition_variable(&this->worker_start_cv_);
  (this->task_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->task_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->task_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->task_).super__Function_base._M_functor + 8) = 0;
  (this->num_reserved_).super___atomic_base<int>._M_i = 0;
  if (0 < (long)this->num_threads_) {
    std::vector<std::thread,_std::allocator<std::thread>_>::reserve
              (&this->threads_,(long)this->num_threads_);
    if (0 < this->num_threads_) {
      iVar1 = 0;
      do {
        local_38 = this;
        std::vector<std::thread,std::allocator<std::thread>>::
        emplace_back<void(&)(highwayhash::ThreadPool*),highwayhash::ThreadPool*>
                  ((vector<std::thread,std::allocator<std::thread>> *)&this->threads_,ThreadFunc,
                   &local_38);
        iVar1 = iVar1 + 1;
      } while (iVar1 < this->num_threads_);
    }
    this->padding_[0] = 0;
    WorkersReadyBarrier(this);
    return;
  }
  printf("data_parallel check failed at line %d\n",0x46);
  abort();
}

Assistant:

explicit ThreadPool(
      const int num_threads = std::thread::hardware_concurrency())
      : num_threads_(num_threads) {
    DATA_PARALLEL_CHECK(num_threads_ > 0);
    threads_.reserve(num_threads_);
    for (int i = 0; i < num_threads_; ++i) {
      threads_.emplace_back(ThreadFunc, this);
    }

    padding_[0] = 0;  // avoid unused member warning.

    WorkersReadyBarrier();
  }